

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt * __thiscall slang::SVInt::assignSlowCase(SVInt *this,SVInt *rhs)

{
  uint64_t *__src;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t *puVar4;
  SVInt *in_RSI;
  SVInt *in_RDI;
  
  if (in_RDI != in_RSI) {
    bVar1 = isSingleWord(in_RSI);
    if (bVar1) {
      if ((in_RDI->super_SVIntStorage).field_0.val != 0) {
        operator_delete__((void *)0x50d01b);
      }
      (in_RDI->super_SVIntStorage).field_0 = (in_RSI->super_SVIntStorage).field_0;
    }
    else {
      bVar1 = isSingleWord(in_RDI);
      if (bVar1) {
        getNumWords((SVInt *)0x50d04a);
        puVar4 = (uint64_t *)operator_new__(0x50d06d);
        (in_RDI->super_SVIntStorage).field_0.pVal = puVar4;
      }
      else {
        uVar2 = getNumWords((SVInt *)0x50d084);
        uVar3 = getNumWords((SVInt *)0x50d092);
        if (uVar2 != uVar3) {
          if ((in_RDI->super_SVIntStorage).field_0.val != 0) {
            operator_delete__((void *)0x50d0b9);
          }
          getNumWords((SVInt *)0x50d0c3);
          puVar4 = (uint64_t *)operator_new__(0x50d0e6);
          (in_RDI->super_SVIntStorage).field_0.pVal = puVar4;
        }
      }
      puVar4 = (in_RDI->super_SVIntStorage).field_0.pVal;
      __src = (in_RSI->super_SVIntStorage).field_0.pVal;
      uVar2 = getNumWords((SVInt *)0x50d116);
      memcpy(puVar4,__src,(ulong)(uVar2 << 3));
    }
    (in_RDI->super_SVIntStorage).bitWidth = (in_RSI->super_SVIntStorage).bitWidth;
    (in_RDI->super_SVIntStorage).signFlag = (bool)((in_RSI->super_SVIntStorage).signFlag & 1);
    (in_RDI->super_SVIntStorage).unknownFlag = (bool)((in_RSI->super_SVIntStorage).unknownFlag & 1);
  }
  return in_RDI;
}

Assistant:

SVInt& SVInt::assignSlowCase(const SVInt& rhs) {
    if (this == &rhs)
        return *this;

    if (rhs.isSingleWord()) {
        delete[] pVal;
        val = rhs.val;
    }
    else {
        if (isSingleWord()) {
            pVal = new uint64_t[rhs.getNumWords()];
        }
        else if (getNumWords() != rhs.getNumWords()) {
            delete[] pVal;
            pVal = new uint64_t[rhs.getNumWords()];
        }
        memcpy(pVal, rhs.pVal, rhs.getNumWords() * WORD_SIZE);
    }
    bitWidth = rhs.bitWidth;
    signFlag = rhs.signFlag;
    unknownFlag = rhs.unknownFlag;
    return *this;
}